

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O2

int loader_handle_populate(void *handle_dest,void *handle_src)

{
  int iVar1;
  context pcVar2;
  context pcVar3;
  vector pvVar4;
  void *handle_dest_local;
  char *duplicated_key;
  
  handle_dest_local = handle_dest;
  pcVar2 = loader_impl_handle_context(handle_dest);
  pcVar3 = loader_impl_handle_context(handle_src);
  iVar1 = context_contains(pcVar3,pcVar2,&duplicated_key);
  if (duplicated_key == (char *)0x0 || iVar1 != 0) {
    iVar1 = context_append(pcVar2,pcVar3);
    if (iVar1 == 0) {
      pvVar4 = loader_impl_handle_populated(handle_src);
      vector_push_back(pvVar4,&handle_dest_local);
      return 0;
    }
  }
  else {
    log_write_impl_va("metacall",0x26d,"loader_handle_populate",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                      ,3,"Duplicated symbol found named \'%s\' already defined in the handle scope",
                      duplicated_key);
  }
  return 1;
}

Assistant:

int loader_handle_populate(void *handle_dest, void *handle_src)
{
	context ctx_dest = loader_impl_handle_context(handle_dest);
	context ctx_src = loader_impl_handle_context(handle_src);
	char *duplicated_key;

	if (context_contains(ctx_src, ctx_dest, &duplicated_key) == 0 && duplicated_key != NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Duplicated symbol found named '%s' already defined in the handle scope", duplicated_key);
		return 1;
	}
	else if (context_append(ctx_dest, ctx_src) == 0)
	{
		vector_push_back_var(loader_impl_handle_populated(handle_src), handle_dest);

		return 0;
	}

	return 1;
}